

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O2

void __thiscall
fmt::v11::detail::parse_format_string<char,fmt::v11::detail::format_string_checker<char,2,0,false>>
          (detail *this,basic_string_view<char> fmt,
          format_string_checker<char,_2,_0,_false> *handler)

{
  detail dVar1;
  int iVar2;
  format_string_checker<char,_2,_0,_false> *this_00;
  detail *pdVar3;
  detail *end;
  id_adapter local_40;
  
  this_00 = (format_string_checker<char,_2,_0,_false> *)fmt.size_;
  end = (detail *)(fmt.data_ + (long)this);
LAB_00176902:
  pdVar3 = this;
  if (pdVar3 == end) {
    return;
  }
  this = pdVar3 + 1;
  if (*pdVar3 != (detail)0x7d) goto code_r0x0017691a;
  if ((this == end) || (*this != (detail)0x7d)) {
    report_error("unmatched \'}\' in format string");
  }
  goto LAB_00176967;
code_r0x0017691a:
  if (*pdVar3 != (detail)0x7b) goto LAB_00176902;
  if (this == end) {
    report_error("invalid format string");
  }
  dVar1 = *this;
  if (dVar1 == (detail)0x3a) {
    iVar2 = compile_parse_context<char>::next_arg_id(&this_00->context_);
  }
  else {
    if (dVar1 == (detail)0x7b) {
LAB_00176967:
      this = pdVar3 + 2;
      goto LAB_00176902;
    }
    if (dVar1 == (detail)0x7d) {
      iVar2 = compile_parse_context<char>::next_arg_id(&this_00->context_);
      format_string_checker<char,_2,_0,_false>::on_replacement_field(this_00,iVar2,(char *)this);
      goto LAB_00176967;
    }
    local_40.arg_id = 0;
    local_40.handler = this_00;
    this = (detail *)
           parse_arg_id<char,fmt::v11::detail::parse_replacement_field<char,fmt::v11::detail::format_string_checker<char,2,0,false>&>(char_const*,char_const*,fmt::v11::detail::format_string_checker<char,2,0,false>&)::id_adapter&>
                     ((char *)this,(char *)end,&local_40);
    if (this == end) {
LAB_00176a13:
      report_error("missing \'}\' in format string");
    }
    iVar2 = local_40.arg_id;
    if (*this != (detail)0x3a) {
      if (*this != (detail)0x7d) goto LAB_00176a13;
      format_string_checker<char,_2,_0,_false>::on_replacement_field
                (this_00,local_40.arg_id,(char *)this);
      goto LAB_001769d8;
    }
  }
  this = (detail *)
         format_string_checker<char,_2,_0,_false>::on_format_specs
                   (this_00,iVar2,(char *)(this + 1),(char *)end);
  if ((this == end) || (*this != (detail)0x7d)) {
    report_error("unknown format specifier");
  }
LAB_001769d8:
  this = this + 1;
  goto LAB_00176902;
}

Assistant:

FMT_CONSTEXPR void parse_format_string(basic_string_view<Char> fmt,
                                       Handler&& handler) {
  auto begin = fmt.data(), end = begin + fmt.size();
  auto p = begin;
  while (p != end) {
    auto c = *p++;
    if (c == '{') {
      handler.on_text(begin, p - 1);
      begin = p = parse_replacement_field(p - 1, end, handler);
    } else if (c == '}') {
      if (p == end || *p != '}')
        return handler.on_error("unmatched '}' in format string");
      handler.on_text(begin, p);
      begin = ++p;
    }
  }
  handler.on_text(begin, end);
}